

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O2

void bssl::anon_unknown_12::VerifyExtendedKeyUsage
               (ParsedCertificate *cert,KeyPurpose required_key_purpose,CertErrors *errors,
               bool is_target_cert,bool is_target_cert_issuer)

{
  bool bVar1;
  bool bVar2;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *pvVar3;
  long lVar4;
  BitString *pBVar5;
  undefined **ppuVar6;
  byte bVar7;
  undefined4 uVar8;
  undefined7 in_register_00000009;
  byte bVar9;
  undefined4 in_register_00000034;
  undefined8 uVar10;
  uint uVar11;
  undefined4 uVar12;
  undefined7 in_register_00000081;
  byte bVar13;
  Input *key_purpose_oid;
  Span<const_unsigned_char> *pSVar14;
  byte bVar15;
  uint uVar16;
  Input rhs;
  Input rhs_00;
  Input rhs_01;
  Input rhs_02;
  Input rhs_03;
  Input rhs_04;
  Input rhs_05;
  Input rhs_06;
  Input rhs_07;
  KeyPurpose required_key_purpose_local;
  uint local_94;
  uint local_90;
  undefined4 local_8c;
  uint local_88;
  uint local_84;
  CertErrors *errors_local;
  anon_class_16_2_fb8ee566 local_78;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined8 local_58;
  CertErrors *local_50;
  ParsedCertificate *local_48;
  Span<const_unsigned_char> *local_40;
  long local_38;
  
  uVar10 = CONCAT44(in_register_00000034,required_key_purpose);
  uVar8 = (undefined4)CONCAT71(in_register_00000009,is_target_cert);
  if (required_key_purpose == ANY_EKU) {
    return;
  }
  required_key_purpose_local = required_key_purpose;
  errors_local = errors;
  if (cert->has_extended_key_usage_ == true) {
    local_60 = (undefined4)CONCAT71(in_register_00000081,is_target_cert_issuer);
    local_64 = uVar8;
    local_58 = uVar10;
    local_50 = errors;
    local_48 = cert;
    pvVar3 = ParsedCertificate::extended_key_usage(cert);
    pSVar14 = &((pvVar3->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
                _M_impl.super__Vector_impl_data._M_start)->data_;
    local_40 = &((pvVar3->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
                 _M_impl.super__Vector_impl_data._M_finish)->data_;
    lVar4 = 1;
    local_8c = 0;
    uVar12 = 0;
    bVar9 = 0;
    local_90 = 0;
    local_94 = 0;
    local_88 = 0;
    bVar13 = 0;
    bVar2 = false;
    local_84 = 0;
    for (; pSVar14 != local_40; pSVar14 = pSVar14 + 1) {
      rhs.data_.size_ = 4;
      rhs.data_.data_ = "U\x1d%";
      local_5c = uVar12;
      local_38 = lVar4;
      bVar1 = bssl::der::operator==((Input)*pSVar14,rhs);
      local_84 = CONCAT31((int3)(local_84 >> 8),(byte)local_84 | bVar1);
      rhs_00.data_.size_ = 8;
      rhs_00.data_.data_ = "+\x06\x01\x05\x05\a\x03\x01+\x06\x01\x05\x05\a\x03\x02GeneralNames";
      bVar1 = bssl::der::operator==((Input)*pSVar14,rhs_00);
      if (bVar1) {
        bVar2 = true;
      }
      rhs_01.data_.size_ = 8;
      rhs_01.data_.data_ = "+\x06\x01\x05\x05\a\x03\x02GeneralNames";
      bVar1 = bssl::der::operator==((Input)*pSVar14,rhs_01);
      if (bVar1) {
        bVar13 = 1;
      }
      rhs_02.data_.size_ = 8;
      rhs_02.data_.data_ = (uchar *)&kCodeSigning;
      bVar1 = bssl::der::operator==((Input)*pSVar14,rhs_02);
      local_88 = CONCAT31((int3)(local_88 >> 8),(byte)local_88 | bVar1);
      rhs_03.data_.size_ = 8;
      rhs_03.data_.data_ = (uchar *)&kTimeStamping;
      bVar1 = bssl::der::operator==((Input)*pSVar14,rhs_03);
      local_94 = CONCAT31((int3)(local_94 >> 8),(byte)local_94 | bVar1);
      rhs_04.data_.size_ = 8;
      rhs_04.data_.data_ = "+\x06\x01\x05\x05\a\x03\tSerial number is not a valid INTEGER";
      bVar1 = bssl::der::operator==((Input)*pSVar14,rhs_04);
      local_90 = CONCAT31((int3)(local_90 >> 8),(byte)local_90 | bVar1);
      rhs_05.data_.size_ = 6;
      rhs_05.data_.data_ = (uchar *)&kRcsMlsClient;
      bVar1 = bssl::der::operator==((Input)*pSVar14,rhs_05);
      bVar9 = bVar9 | bVar1;
      rhs_06.data_.size_ = 8;
      rhs_06.data_.data_ =
           "+\x06\x01\x05\x05\a\x03\x04+\x06\x01\x05\x05\a\x03$/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
      ;
      bVar1 = bssl::der::operator==((Input)*pSVar14,rhs_06);
      local_8c = CONCAT31((int3)((uint)local_8c >> 8),(byte)local_8c | bVar1);
      rhs_07.data_.size_ = 8;
      rhs_07.data_.data_ =
           "+\x06\x01\x05\x05\a\x03$/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
      ;
      bVar1 = bssl::der::operator==((Input)*pSVar14,rhs_07);
      uVar12 = CONCAT31((int3)((uint)local_5c >> 8),(byte)local_5c | bVar1);
      lVar4 = local_38 + -1;
    }
    bVar9 = bVar9 ^ 1 | lVar4 != 0;
    is_target_cert_issuer = SUB41(local_60,0);
    cert = local_48;
    uVar10 = local_58;
    errors = local_50;
    uVar16 = local_84;
    uVar11 = local_88;
    uVar8 = local_64;
  }
  else {
    bVar9 = 1;
    local_8c = 0;
    uVar12 = 0;
    local_90 = 0;
    local_94 = 0;
    uVar11 = 0;
    bVar13 = 0;
    bVar2 = false;
    uVar16 = 0;
  }
  bVar7 = (byte)uVar8;
  bVar15 = (byte)uVar16;
  switch((int)uVar10) {
  case 4:
    if (bVar7 == 0) {
      required_key_purpose_local = SERVER_AUTH;
      goto LAB_0038b32d;
    }
    required_key_purpose_local = SERVER_AUTH_STRICT;
LAB_0038b1b9:
    local_78.errors = &errors_local;
    local_78.required_key_purpose = &required_key_purpose_local;
    if (cert->has_extended_key_usage_ == false) {
      CertErrors::AddWarning(errors,"Certificate does not have extended key usage");
      goto LAB_0038b388;
    }
    if ((uVar11 & 1) != 0) {
      VerifyExtendedKeyUsage::anon_class_16_2_fb8ee566::operator()
                (&local_78,
                 "The extended key usage includes code signing which is not permitted for this use")
      ;
    }
    if ((local_90 & 1) != 0) {
      ppuVar6 = &cert_errors::kEkuHasProhibitedOCSPSigning;
      goto LAB_0038b348;
    }
    goto LAB_0038b361;
  default:
    if (bVar7 != 0) goto LAB_0038b1b9;
    goto LAB_0038b32d;
  case 6:
    if (bVar7 != 0) {
      required_key_purpose_local = CLIENT_AUTH_STRICT;
      goto LAB_0038b1b9;
    }
    required_key_purpose_local = CLIENT_AUTH;
LAB_0038b32d:
    local_78.errors = &errors_local;
    local_78.required_key_purpose = &required_key_purpose_local;
    if ((is_target_cert_issuer != false) && (cert->has_extended_key_usage_ == true)) {
      if ((uVar11 & 1) != 0) {
        ppuVar6 = &cert_errors::kEkuHasProhibitedCodeSigning;
LAB_0038b348:
        VerifyExtendedKeyUsage::anon_class_16_2_fb8ee566::operator()(&local_78,*ppuVar6);
      }
LAB_0038b361:
      if ((local_94 & 1) != 0) {
        VerifyExtendedKeyUsage::anon_class_16_2_fb8ee566::operator()
                  (&local_78,
                   "The extended key usage includes time stamping which is not permitted for this use"
                  );
      }
    }
LAB_0038b388:
    if (required_key_purpose_local < (C2PA_TIMESTAMPING|CLIENT_AUTH)) {
      if ((10U >> (required_key_purpose_local & 0x1f) & 1) == 0) {
        if ((0x24U >> (required_key_purpose_local & 0x1f) & 1) == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                        ,0x1a6,
                        "void bssl::(anonymous namespace)::VerifyExtendedKeyUsage(const ParsedCertificate &, KeyPurpose, CertErrors *, bool, bool)"
                       );
        }
        bVar9 = bVar13;
        if ((((uVar16 & 1) != 0) && (bVar13 == 0)) &&
           (bVar9 = 1, (bVar7 | is_target_cert_issuer) == 1)) {
          CertErrors::AddWarning
                    (errors_local,
                     "The extended key usage does not include client auth but instead includes anyExtendedKeyUsage"
                    );
          bVar9 = bVar13;
        }
        if (required_key_purpose_local == CLIENT_AUTH) {
          bVar9 = bVar9 | bVar15 | ~cert->has_extended_key_usage_;
        }
        if ((bVar9 & 1) != 0) {
          return;
        }
        ppuVar6 = &cert_errors::kEkuLacksClientAuth;
      }
      else {
        bVar1 = bVar2;
        if ((((uVar16 & 1) != 0) && (!bVar2)) &&
           (bVar1 = true, (bVar7 | is_target_cert_issuer) == 1)) {
          CertErrors::AddWarning
                    (errors_local,
                     "The extended key usage does not include server auth but instead includes anyExtendeKeyUsage"
                    );
          bVar1 = bVar2;
        }
        bVar2 = true;
        if ((cert->has_extended_key_usage_ & 1U) != 0) {
          bVar2 = bVar1;
        }
        if (is_target_cert_issuer == false) {
          bVar2 = bVar1;
        }
        if (required_key_purpose_local == SERVER_AUTH) {
          if (((~cert->has_extended_key_usage_ | bVar15) & 1) != 0 || bVar2) {
            return;
          }
        }
        else if (bVar2) {
          return;
        }
        ppuVar6 = &cert_errors::kEkuLacksServerAuth;
      }
      CertErrors::AddError(errors_local,*ppuVar6);
    }
    return;
  case 7:
    if (bVar7 != 0) {
      if (cert->has_key_usage_ == true) {
        pBVar5 = ParsedCertificate::key_usage(cert);
        bVar2 = bssl::der::BitString::AssertsBit(pBVar5,0);
        if (((bVar2) &&
            (pBVar5 = ParsedCertificate::key_usage(cert), (pBVar5->bytes_).data_.size_ == 1)) &&
           (pBVar5 = ParsedCertificate::key_usage(cert), pBVar5->unused_bits_ == '\a'))
        goto LAB_0038b175;
      }
      CertErrors::AddError
                (errors,"KeyUsage must have only the digitalSignature bit set for rcsMlsClient auth"
                );
    }
LAB_0038b175:
    if (cert->has_extended_key_usage_ == false) {
      ppuVar6 = &cert_errors::kEkuNotPresent;
    }
    else {
      if (bVar9 == 0) {
        return;
      }
      ppuVar6 = &cert_errors::kEkuIncorrectForRcsMlsClient;
    }
    break;
  case 8:
    if (bVar7 == 0) {
      return;
    }
    if (cert->has_extended_key_usage_ == false) {
      CertErrors::AddError(errors,"Certificate does not have extended key usage");
    }
    if (((((byte)uVar12 | (byte)local_8c | bVar15 | (byte)local_90) & 1) == 0) &&
       ((((byte)local_94 ^ 1) & 1) == 0)) {
      return;
    }
    ppuVar6 = &cert_errors::kEkuIncorrectForC2PATimeStamping;
    break;
  case 9:
    if (bVar7 == 0) {
      return;
    }
    if (cert->has_extended_key_usage_ == false) {
      CertErrors::AddError(errors,"Certificate does not have extended key usage");
    }
    if (cert->has_key_usage_ == true) {
      pBVar5 = ParsedCertificate::key_usage(cert);
      bVar2 = bssl::der::BitString::AssertsBit(pBVar5,0);
      if ((((bVar15 | (byte)local_90 | (byte)local_94 | ~bVar2) & 1) == 0) &&
         ((((byte)local_8c | (byte)uVar12) & 1) != 0)) {
        return;
      }
    }
    ppuVar6 = &cert_errors::kEkuIncorrectForC2PAManifest;
  }
  CertErrors::AddError(errors,*ppuVar6);
  return;
}

Assistant:

void VerifyExtendedKeyUsage(const ParsedCertificate &cert,
                            KeyPurpose required_key_purpose, CertErrors *errors,
                            bool is_target_cert, bool is_target_cert_issuer) {
  // We treat a required KeyPurpose of ANY_EKU to mean "Do not check EKU"
  if (required_key_purpose == KeyPurpose::ANY_EKU) {
    return;
  }
  bool has_any_eku = false;
  bool has_server_auth_eku = false;
  bool has_client_auth_eku = false;
  bool has_code_signing_eku = false;
  bool has_time_stamping_eku = false;
  bool has_ocsp_signing_eku = false;
  bool has_rcs_mls_client_eku = false;
  bool has_document_signing_eku = false;
  bool has_email_protection_eku = false;
  size_t eku_oid_count = 0;
  if (cert.has_extended_key_usage()) {
    for (const auto &key_purpose_oid : cert.extended_key_usage()) {
      eku_oid_count++;
      if (key_purpose_oid == der::Input(kAnyEKU)) {
        has_any_eku = true;
      }
      if (key_purpose_oid == der::Input(kServerAuth)) {
        has_server_auth_eku = true;
      }
      if (key_purpose_oid == der::Input(kClientAuth)) {
        has_client_auth_eku = true;
      }
      if (key_purpose_oid == der::Input(kCodeSigning)) {
        has_code_signing_eku = true;
      }
      if (key_purpose_oid == der::Input(kTimeStamping)) {
        has_time_stamping_eku = true;
      }
      if (key_purpose_oid == der::Input(kOCSPSigning)) {
        has_ocsp_signing_eku = true;
      }
      if (key_purpose_oid == der::Input(kRcsMlsClient)) {
        has_rcs_mls_client_eku = true;
      }
      if (key_purpose_oid == der::Input(kEmailProtection)) {
        has_email_protection_eku = true;
      }
      if (key_purpose_oid == der::Input(kDocumentSigning)) {
        has_document_signing_eku = true;
      }
    }
  }

  if (required_key_purpose == KeyPurpose::RCS_MLS_CLIENT_AUTH) {
    // Enforce the key usage restriction for a leaf from section A.3.8.3 here
    // as well.
    if (is_target_cert &&
        (!cert.has_key_usage() ||
         // This works to enforce that digital signature is the only bit because
         // digital signature is bit 0.
         !cert.key_usage().AssertsBit(KEY_USAGE_BIT_DIGITAL_SIGNATURE) ||
         cert.key_usage().bytes().size() != 1 ||
         cert.key_usage().unused_bits() != 7)) {
      errors->AddError(cert_errors::kKeyUsageIncorrectForRcsMlsClient);
    }
    // Rules for MLS client auth. For the leaf and all intermediates, EKU must
    // be present and have exactly one EKU which is rcsMlsClient.
    if (!cert.has_extended_key_usage()) {
      errors->AddError(cert_errors::kEkuNotPresent);
    } else if (eku_oid_count != 1 || !has_rcs_mls_client_eku) {
      errors->AddError(cert_errors::kEkuIncorrectForRcsMlsClient);
    }
    return;
  }

  if (required_key_purpose == KeyPurpose::C2PA_TIMESTAMPING) {
    // https://c2pa.org/specifications/specifications/2.1/specs/C2PA_Specification.html#_certificate_profiles
    // For time stamp signing, C2PA requires that the leaf:
    // 1) must have EKU
    // 2) must not have EKU ANY, OCSP signing, document signing, or email protection
    // 3) must have time stamping
    // 4) should tolerate other EKU's being present.
    if (is_target_cert) {
      if (!cert.has_extended_key_usage()) {
        errors->AddError(cert_errors::kEkuNotPresent);
      }
      if (has_any_eku || has_ocsp_signing_eku || has_document_signing_eku ||
          has_email_protection_eku || !has_time_stamping_eku) {
        errors->AddError(cert_errors::kEkuIncorrectForC2PATimeStamping);
      }
    }
    return;
  }

  if (required_key_purpose == KeyPurpose::C2PA_MANIFEST) {
    // https://c2pa.org/specifications/specifications/2.1/specs/C2PA_Specification.html#_certificate_profiles
    // For manifest signing, C2PA requires that the leaf:
    // 1) must have EKU
    // 2) must not have EKU ANY, time stamping, or OCSP signing
    // 3) should have document signing and/or email protection
    // 4) should tolerate other EKU's being present.
    if (is_target_cert) {
      if (!cert.has_extended_key_usage()) {
        errors->AddError(cert_errors::kEkuNotPresent);
      }
      if (!cert.has_key_usage() ||
          !cert.key_usage().AssertsBit(KEY_USAGE_BIT_DIGITAL_SIGNATURE) ||
          has_any_eku || has_ocsp_signing_eku || has_time_stamping_eku ||
          (!has_email_protection_eku && !has_document_signing_eku)) {
        errors->AddError(cert_errors::kEkuIncorrectForC2PAManifest);
      }
    }
    return;
  }

  // Rules TLS client and server authentication variants.

  // Apply strict only to leaf certificates in these cases.
  if (required_key_purpose == KeyPurpose::CLIENT_AUTH_STRICT_LEAF) {
    if (!is_target_cert) {
      required_key_purpose = KeyPurpose::CLIENT_AUTH;
    } else {
      required_key_purpose = KeyPurpose::CLIENT_AUTH_STRICT;
    }
  }

  if (required_key_purpose == KeyPurpose::SERVER_AUTH_STRICT_LEAF) {
    if (!is_target_cert) {
      required_key_purpose = KeyPurpose::SERVER_AUTH;
    } else {
      required_key_purpose = KeyPurpose::SERVER_AUTH_STRICT;
    }
  }

  auto add_error_if_strict = [&](CertErrorId id) {
    if (required_key_purpose == KeyPurpose::SERVER_AUTH_STRICT ||
        required_key_purpose == KeyPurpose::CLIENT_AUTH_STRICT) {
      errors->AddError(id);
    } else {
      errors->AddWarning(id);
    }
  };
  if (is_target_cert) {
    // Loosely based upon CABF BR version 1.8.4, 7.1.2.3(f).  We are more
    // permissive in that we still allow EKU any to be present in a leaf
    // certificate, but we ignore it for purposes of server or client auth.  We
    // are less permissive in that we prohibit Code Signing, OCSP Signing, and
    // Time Stamping which are currently only a SHOULD NOT. The BR does
    // explicitly allow Email authentication to be present, as this still exists
    // in the wild (2022), so we do not prohibit Email authentication here (and
    // by extension must allow it to be present in the signer, below).
    if (!cert.has_extended_key_usage()) {
      // This is added as a warning, an error will be added in STRICT modes
      // if we then lack client or server auth due to this not being present.
      errors->AddWarning(cert_errors::kEkuNotPresent);
    } else {
      if (has_code_signing_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedCodeSigning);
      }
      if (has_ocsp_signing_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedOCSPSigning);
      }
      if (has_time_stamping_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedTimeStamping);
      }
    }
  } else if (is_target_cert_issuer) {
    // Handle the decision to overload EKU as a constraint on issuers.
    //
    // CABF BR version 1.8.4, 7.1.2.2(g) pertains to the case of "Certs used to
    // issue TLS certificates", While the BR refers to the entire chain of
    // intermediates, there are a number of exceptions regarding CA ownership
    // and cross signing which are impossible for us to know or enforce here.
    // Therefore, we can only enforce at the level of the intermediate that
    // issued our target certificate. This means we we differ in the following
    // ways:
    // - We only enforce at the issuer of the TLS certificate.
    // - We allow email protection to exist in the issuer, since without
    //   this it can not be allowed in the client (other than via EKU any))
    // - As in the leaf certificate case, we allow EKU any to be present, but
    //   we ignore it for the purposes of server or client auth.
    //
    // At this time (until at least 2023) some intermediates are lacking EKU in
    // the world at large from common CA's, so we allow the noEKU case to permit
    // everything.
    // TODO(bbe): enforce requiring EKU in the issuer when we can manage it.
    if (cert.has_extended_key_usage()) {
      if (has_code_signing_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedCodeSigning);
      }
      if (has_time_stamping_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedTimeStamping);
      }
    }
  }
  // Otherwise, we are a parent of an issuer of a TLS certificate.  The CABF
  // BR version 1.8.4, 7.1.2.2(g) goes as far as permitting EKU any in certain
  // cases of Cross Signing and CA Ownership, having permitted cases where EKU
  // is permitted to not be present at all. These cases are not practical to
  // differentiate here and therefore we don't attempt to enforce any further
  // EKU "constraints" on such certificates. Unlike the above cases we also
  // allow the use of EKU any for client or server auth constraint purposes.

  switch (required_key_purpose) {
    case KeyPurpose::ANY_EKU:
    case KeyPurpose::CLIENT_AUTH_STRICT_LEAF:
    case KeyPurpose::SERVER_AUTH_STRICT_LEAF:
    case KeyPurpose::RCS_MLS_CLIENT_AUTH:
    case KeyPurpose::C2PA_TIMESTAMPING:
    case KeyPurpose::C2PA_MANIFEST:
      assert(0);  // NOTREACHED
      return;
    case KeyPurpose::SERVER_AUTH:
    case KeyPurpose::SERVER_AUTH_STRICT: {
      if (has_any_eku && !has_server_auth_eku) {
        if (is_target_cert || is_target_cert_issuer) {
          errors->AddWarning(cert_errors::kEkuLacksServerAuthButHasAnyEKU);
        } else {
          // Accept anyEKU for server auth below target issuer.
          has_server_auth_eku = true;
        }
      }
      if (is_target_cert_issuer && !cert.has_extended_key_usage()) {
        // Accept noEKU for server auth in target issuer.
        // TODO(bbe): remove this once BR requirements catch up with CA's.
        has_server_auth_eku = true;
      }
      if (required_key_purpose == KeyPurpose::SERVER_AUTH) {
        // Legacy compatible.
        if (cert.has_extended_key_usage() && !has_server_auth_eku &&
            !has_any_eku) {
          errors->AddError(cert_errors::kEkuLacksServerAuth);
        }
      } else {
        if (!has_server_auth_eku) {
          errors->AddError(cert_errors::kEkuLacksServerAuth);
        }
      }
      break;
    }
    case KeyPurpose::CLIENT_AUTH:
    case KeyPurpose::CLIENT_AUTH_STRICT: {
      if (has_any_eku && !has_client_auth_eku) {
        if (is_target_cert || is_target_cert_issuer) {
          errors->AddWarning(cert_errors::kEkuLacksClientAuthButHasAnyEKU);
        } else {
          // accept anyEKU for client auth.
          has_client_auth_eku = true;
        }
      }
      if (required_key_purpose == KeyPurpose::CLIENT_AUTH) {
        // Legacy-compatible.
        if (cert.has_extended_key_usage() && !has_client_auth_eku &&
            !has_any_eku) {
          errors->AddError(cert_errors::kEkuLacksClientAuth);
        }
      } else {
        if (!has_client_auth_eku) {
          errors->AddError(cert_errors::kEkuLacksClientAuth);
        }
      }
      break;
    }
  }
}